

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_column_data.cpp
# Opt level: O3

void __thiscall
duckdb::ArrayColumnData::ArrayColumnData
          (ArrayColumnData *this,BlockManager *block_manager,DataTableInfo *info,idx_t column_index,
          idx_t start_row,LogicalType *type_p,optional_ptr<duckdb::ColumnData,_true> parent)

{
  _Head_base<0UL,_duckdb::ColumnData_*,_false> _Var1;
  LogicalType *type;
  undefined1 local_50 [32];
  
  LogicalType::LogicalType((LogicalType *)(local_50 + 8),type_p);
  ColumnData::ColumnData
            (&this->super_ColumnData,block_manager,info,column_index,start_row,
             (LogicalType *)(local_50 + 8),parent);
  LogicalType::~LogicalType((LogicalType *)(local_50 + 8));
  (this->super_ColumnData)._vptr_ColumnData = (_func_int **)&PTR__ArrayColumnData_0246aa38;
  (this->child_column).
  super_unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>_>._M_t.
  super___uniq_ptr_impl<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::ColumnData_*,_std::default_delete<duckdb::ColumnData>_>.
  super__Head_base<0UL,_duckdb::ColumnData_*,_false>._M_head_impl = (ColumnData *)0x0;
  ValidityColumnData::ValidityColumnData
            (&this->validity,block_manager,info,0,start_row,&this->super_ColumnData);
  type = ArrayType::GetChildType(&(this->super_ColumnData).type);
  ColumnData::CreateColumnUnique
            ((ColumnData *)local_50,block_manager,info,1,start_row,type,
             (optional_ptr<duckdb::ColumnData,_true>)this);
  _Var1._M_head_impl =
       (this->child_column).
       super_unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>_>._M_t.
       super___uniq_ptr_impl<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::ColumnData_*,_std::default_delete<duckdb::ColumnData>_>.
       super__Head_base<0UL,_duckdb::ColumnData_*,_false>._M_head_impl;
  (this->child_column).
  super_unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>_>._M_t.
  super___uniq_ptr_impl<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::ColumnData_*,_std::default_delete<duckdb::ColumnData>_>.
  super__Head_base<0UL,_duckdb::ColumnData_*,_false>._M_head_impl = (ColumnData *)local_50._0_8_;
  if (_Var1._M_head_impl != (ColumnData *)0x0) {
    (**(code **)((long)(_Var1._M_head_impl)->_vptr_ColumnData + 8))();
  }
  return;
}

Assistant:

ArrayColumnData::ArrayColumnData(BlockManager &block_manager, DataTableInfo &info, idx_t column_index, idx_t start_row,
                                 LogicalType type_p, optional_ptr<ColumnData> parent)
    : ColumnData(block_manager, info, column_index, start_row, std::move(type_p), parent),
      validity(block_manager, info, 0, start_row, *this) {
	D_ASSERT(type.InternalType() == PhysicalType::ARRAY);
	auto &child_type = ArrayType::GetChildType(type);
	// the child column, with column index 1 (0 is the validity mask)
	child_column = ColumnData::CreateColumnUnique(block_manager, info, 1, start_row, child_type, this);
}